

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

void __thiscall Task::clear(Task *this)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<Task> *psVar3;
  shared_ptr<Task> local_90;
  shared_ptr<Task> local_80;
  reference local_70;
  OperandUsage *usage_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range1_1;
  shared_ptr<Task> local_40;
  reference local_30;
  OperandUsage *usage;
  iterator __end1;
  iterator __begin1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range1;
  Task *this_local;
  
  this->time_stamp = 0;
  this->execution_memory = 0;
  __end1 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&this->ins);
  usage = (OperandUsage *)std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&this->ins);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                *)&usage);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
               ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    local_30->version = (long)peVar2->id;
    std::shared_ptr<Task>::shared_ptr(&local_40,(nullptr_t)0x0);
    psVar3 = std::shared_ptr<Task>::operator=(&local_30->next_use,&local_40);
    std::shared_ptr<Task>::operator=(&local_30->prev_use,psVar3);
    std::shared_ptr<Task>::~shared_ptr(&local_40);
    std::shared_ptr<Task>::shared_ptr((shared_ptr<Task> *)&__range1_1,(nullptr_t)0x0);
    psVar3 = std::shared_ptr<Task>::operator=(&local_30->last_use,(shared_ptr<Task> *)&__range1_1);
    psVar3 = std::shared_ptr<Task>::operator=(&local_30->gen,psVar3);
    std::shared_ptr<Task>::operator=(&local_30->next_gen,psVar3);
    std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&this->outs);
  usage_1 = (OperandUsage *)
            std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&this->outs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                        *)&usage_1);
    if (!bVar1) break;
    local_70 = __gnu_cxx::
               __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
               ::operator*(&__end1_1);
    peVar2 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_70);
    local_70->version = (long)peVar2->id;
    std::shared_ptr<Task>::shared_ptr(&local_80,(nullptr_t)0x0);
    psVar3 = std::shared_ptr<Task>::operator=(&local_70->next_use,&local_80);
    std::shared_ptr<Task>::operator=(&local_70->prev_use,psVar3);
    std::shared_ptr<Task>::~shared_ptr(&local_80);
    std::shared_ptr<Task>::shared_ptr(&local_90,(nullptr_t)0x0);
    psVar3 = std::shared_ptr<Task>::operator=(&local_70->last_use,&local_90);
    psVar3 = std::shared_ptr<Task>::operator=(&local_70->gen,psVar3);
    std::shared_ptr<Task>::operator=(&local_70->next_gen,psVar3);
    std::shared_ptr<Task>::~shared_ptr(&local_90);
    __gnu_cxx::
    __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>::
    operator++(&__end1_1);
  }
  std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::clear
            (&this->to_dealloc_after);
  return;
}

Assistant:

void clear() {
        time_stamp = 0;
        execution_memory = 0;
        for (auto &usage: ins) {
            usage.version = usage.operand->id;
            usage.prev_use = usage.next_use = nullptr;
            usage.next_gen = usage.gen = usage.last_use = nullptr;
        }
        for (auto &usage: outs) {
            usage.version = usage.operand->id;
            usage.prev_use = usage.next_use = nullptr;
            usage.next_gen = usage.gen = usage.last_use = nullptr;
        }
        to_dealloc_after.clear();
    }